

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

void __thiscall NEST::LArNEST::LArNEST(LArNEST *this,VDetector *detector)

{
  VDetector *detector_local;
  LArNEST *this_local;
  
  NESTcalc::NESTcalc(&this->super_NESTcalc,detector);
  (this->super_NESTcalc)._vptr_NESTcalc = (_func_int **)&PTR__LArNEST_00133b48;
  this->fUseDokeBirks = false;
  this->fDensity = 1.393;
  this->fRIdealGas = 8.31446261815324;
  this->fRealGasA = 0.1355;
  this->fRealGasB = 3.201e-05;
  this->fTemperature = 85.0;
  this->fWorkQuantaFunction = 19.5;
  this->fWorkIonFunction = 23.6;
  this->fWorkPhotonFunction = 14.544;
  this->fNexOverNion = 0.21;
  this->fALF = 0.8264462809917356;
  this->fFanoER = 0.1115;
  LArNRYieldsParameters::LArNRYieldsParameters(&this->fNR);
  LArERYieldsParameters::LArERYieldsParameters(&this->fER);
  LArAlphaYieldsParameters::LArAlphaYieldsParameters(&this->fAlpha);
  ThomasImelParameters::ThomasImelParameters(&this->fThomasImelParameters);
  DriftParameters::DriftParameters(&this->fDriftParameters);
  return;
}

Assistant:

LArNEST::LArNEST(VDetector *detector) : NESTcalc(detector) {}